

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

string * intgemm::PrintMatrix<signed_char>
                   (string *__return_storage_ptr__,char *mem,Index rows,Index cols)

{
  string *psVar1;
  ostream *poVar2;
  Index IVar3;
  ulong uVar4;
  int iVar5;
  ostringstream out;
  char local_1c5;
  Index local_1c4;
  Index local_1c0;
  int local_1bc;
  string *local_1b8;
  ulong local_1b0;
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1c0 = rows;
  if (rows != 0) {
    local_1b0 = (ulong)cols;
    iVar5 = 0;
    IVar3 = 0;
    local_1c4 = cols;
    do {
      uVar4 = local_1b0;
      local_1bc = iVar5;
      if (local_1c4 != 0) {
        do {
          *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
          poVar2 = std::ostream::_M_insert<long>((long)local_1a8);
          local_1c5 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1c5,1);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      local_1c5 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1c5,1);
      IVar3 = IVar3 + 1;
      iVar5 = local_1bc + local_1c4;
    } while (IVar3 != local_1c0);
  }
  psVar1 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string PrintMatrix(const Type *mem, Index rows, Index cols) {
  std::ostringstream out;
  for (Index r = 0; r < rows; ++r) {
    for (Index c = 0; c < cols; ++c) {
      out << std::setw(4) << (int64_t) mem[r * cols + c] << ' ';
    }
    out << '\n';
  }
  return out.str();
}